

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O0

int cgltf_parse_json_string_array
              (cgltf_options *options,jsmntok_t *tokens,int i,uint8_t *json_chunk,char ***out_array,
              cgltf_size *out_size)

{
  ulong local_48;
  cgltf_size j;
  cgltf_size *out_size_local;
  char ***out_array_local;
  uint8_t *json_chunk_local;
  int i_local;
  jsmntok_t *tokens_local;
  cgltf_options *options_local;
  
  if (tokens[i].type == JSMN_ARRAY) {
    json_chunk_local._4_4_ =
         cgltf_parse_json_array(options,tokens,i,json_chunk,8,out_array,out_size);
    options_local._4_4_ = json_chunk_local._4_4_;
    if (-1 < json_chunk_local._4_4_) {
      for (local_48 = 0; local_48 < *out_size; local_48 = local_48 + 1) {
        json_chunk_local._4_4_ =
             cgltf_parse_json_string
                       (options,tokens,json_chunk_local._4_4_,json_chunk,*out_array + local_48);
        if (json_chunk_local._4_4_ < 0) {
          return json_chunk_local._4_4_;
        }
      }
      options_local._4_4_ = json_chunk_local._4_4_;
    }
  }
  else {
    options_local._4_4_ = -1;
  }
  return options_local._4_4_;
}

Assistant:

static int cgltf_parse_json_string_array(cgltf_options* options, jsmntok_t const* tokens, int i, const uint8_t* json_chunk, char*** out_array, cgltf_size* out_size)
{
	CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_ARRAY);
	i = cgltf_parse_json_array(options, tokens, i, json_chunk, sizeof(char*), (void**)out_array, out_size);
	if (i < 0)
	{
		return i;
	}

	for (cgltf_size j = 0; j < *out_size; ++j)
	{
		i = cgltf_parse_json_string(options, tokens, i, json_chunk, j + (*out_array));
		if (i < 0)
		{
			return i;
		}
	}
	return i;
}